

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentParser.hpp
# Opt level: O2

string * __thiscall
Utils::ArgumentParser::get_message_abi_cxx11_(string *__return_storage_ptr__,ArgumentParser *this)

{
  pointer ppVVar1;
  pointer ppAVar2;
  ArgumentParser *pAVar3;
  pointer ppVVar4;
  pointer ppAVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_78;
  ArgumentParser *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::operator+(__return_storage_ptr__,"Usage: ",&this->program_name);
  if (((this->options).
       super__Vector_base<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_>._M_impl.
       super__Vector_impl_data._M_start !=
       (this->options).
       super__Vector_base<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_>._M_impl.
       super__Vector_impl_data._M_finish) ||
     ((this->flags).super__Vector_base<Utils::ArgFlag_*,_std::allocator<Utils::ArgFlag_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->flags).super__Vector_base<Utils::ArgFlag_*,_std::allocator<Utils::ArgFlag_*>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  ppVVar1 = (this->positionals).
            super__Vector_base<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  local_58 = this;
  for (ppVVar4 = (this->positionals).
                 super__Vector_base<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; pAVar3 = local_58, ppVVar4 != ppVVar1;
      ppVVar4 = ppVVar4 + 1) {
    std::operator+(&local_50," [",&((*ppVVar4)->super_ArgObject).name);
    std::operator+(&bStack_78,&local_50,"]");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&bStack_78);
    std::__cxx11::string::~string((string *)&local_50);
  }
  wrap_string(&local_50,&local_58->short_text,0,0x50);
  std::operator+(&bStack_78,"\n",&local_50);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&bStack_78);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  ppVVar1 = (pAVar3->positionals).
            super__Vector_base<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppVVar4 = (pAVar3->positionals).
                 super__Vector_base<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppVVar4 != ppVVar1; ppVVar4 = ppVVar4 + 1
      ) {
    (*((*ppVVar4)->super_ArgObject)._vptr_ArgObject[2])(&bStack_78);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&bStack_78);
  }
  ppVVar1 = (pAVar3->options).
            super__Vector_base<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppVVar4 = (pAVar3->options).
                 super__Vector_base<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppVVar4 != ppVVar1; ppVVar4 = ppVVar4 + 1
      ) {
    (*((*ppVVar4)->super_ArgObject)._vptr_ArgObject[2])(&bStack_78);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&bStack_78);
  }
  ppAVar2 = (pAVar3->flags).super__Vector_base<Utils::ArgFlag_*,_std::allocator<Utils::ArgFlag_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppAVar5 = (pAVar3->flags).
                 super__Vector_base<Utils::ArgFlag_*,_std::allocator<Utils::ArgFlag_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppAVar5 != ppAVar2; ppAVar5 = ppAVar5 + 1) {
    (*((*ppAVar5)->super_ArgObject)._vptr_ArgObject[2])(&bStack_78);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&bStack_78);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  wrap_string(&bStack_78,&pAVar3->long_text,0,0x50);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&bStack_78);
  return __return_storage_ptr__;
}

Assistant:

inline std::string ArgumentParser::get_message() const {

    std::string message("Usage: "+program_name);
    if  ( !options.empty() || !flags.empty() ) message+=" {OPTIONS}";
    for (auto i : positionals)                 message+=" ["+i->get_name()+"]";

    message += "\n" + wrap_string(short_text,0,80);
    message += "\nOptions:\n";

    for (auto i : positionals) { message += i->get_message(); }
    for (auto i : options)     { message += i->get_message(); }
    for (auto i : flags)       { message += i->get_message(); }

    message+= "\n";
    message += wrap_string(long_text,0,80);
    return message;
}